

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proitems.h
# Opt level: O2

QByteArray * __thiscall ProString::toLatin1(QByteArray *__return_storage_ptr__,ProString *this)

{
  long in_FS_OFFSET;
  QStringView local_28;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_28.m_data = (this->m_string).d.ptr;
  local_28.m_size = (this->m_string).d.size;
  local_28 = QStringView::mid(&local_28,(long)this->m_offset,(long)this->m_length);
  QStringView::toLatin1(__return_storage_ptr__,&local_28);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QByteArray toLatin1() const { return toQStringView().toLatin1(); }